

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_2,_2>,_tcu::Vector<double,_2>,_tcu::Vector<double,_2>_>::call
          (binary<tcu::Matrix<double,_2,_2>,_tcu::Vector<double,_2>,_tcu::Vector<double,_2>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  Matrix<double,_2,_2> result;
  Matrix<double,_2,_2> local_68;
  Matrix<double,_2,_2> local_48;
  
  GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  tcu::Matrix<double,_2,_2>::Matrix(&local_48);
  (*pcVar1)(&local_68);
  tcu::Matrix<double,_2,_2>::operator=(&local_48,&local_68);
  pack<tcu::Matrix<double,_2,_2>_>::set(result_dst,&local_48);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}